

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

void xmlCtxtDumpDocumentHead(xmlDebugCtxtPtr ctxt,xmlDocPtr doc)

{
  xmlDocPtr doc_local;
  xmlDebugCtxtPtr ctxt_local;
  
  if (doc != (xmlDocPtr)0x0) {
    xmlCtxtDumpDocHead(ctxt,doc);
    if (ctxt->check == 0) {
      if (doc->name != (char *)0x0) {
        fprintf((FILE *)ctxt->output,"name=");
        xmlCtxtDumpString(ctxt,(xmlChar *)doc->name);
        fprintf((FILE *)ctxt->output,"\n");
      }
      if (doc->version != (xmlChar *)0x0) {
        fprintf((FILE *)ctxt->output,"version=");
        xmlCtxtDumpString(ctxt,doc->version);
        fprintf((FILE *)ctxt->output,"\n");
      }
      if (doc->encoding != (xmlChar *)0x0) {
        fprintf((FILE *)ctxt->output,"encoding=");
        xmlCtxtDumpString(ctxt,doc->encoding);
        fprintf((FILE *)ctxt->output,"\n");
      }
      if (doc->URL != (xmlChar *)0x0) {
        fprintf((FILE *)ctxt->output,"URL=");
        xmlCtxtDumpString(ctxt,doc->URL);
        fprintf((FILE *)ctxt->output,"\n");
      }
      if (doc->standalone != 0) {
        fprintf((FILE *)ctxt->output,"standalone=true\n");
      }
    }
    if (doc->oldNs != (_xmlNs *)0x0) {
      xmlCtxtDumpNamespaceList(ctxt,doc->oldNs);
    }
  }
  return;
}

Assistant:

static void
xmlCtxtDumpDocumentHead(xmlDebugCtxtPtr ctxt, xmlDocPtr doc)
{
    if (doc == NULL) return;
    xmlCtxtDumpDocHead(ctxt, doc);
    if (!ctxt->check) {
        if (doc->name != NULL) {
            fprintf(ctxt->output, "name=");
            xmlCtxtDumpString(ctxt, BAD_CAST doc->name);
            fprintf(ctxt->output, "\n");
        }
        if (doc->version != NULL) {
            fprintf(ctxt->output, "version=");
            xmlCtxtDumpString(ctxt, doc->version);
            fprintf(ctxt->output, "\n");
        }
        if (doc->encoding != NULL) {
            fprintf(ctxt->output, "encoding=");
            xmlCtxtDumpString(ctxt, doc->encoding);
            fprintf(ctxt->output, "\n");
        }
        if (doc->URL != NULL) {
            fprintf(ctxt->output, "URL=");
            xmlCtxtDumpString(ctxt, doc->URL);
            fprintf(ctxt->output, "\n");
        }
        if (doc->standalone)
            fprintf(ctxt->output, "standalone=true\n");
    }
    if (doc->oldNs != NULL)
        xmlCtxtDumpNamespaceList(ctxt, doc->oldNs);
}